

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

void xmlSchemaElementDump
               (void *payload,void *data,xmlChar *name,xmlChar *namespace,xmlChar *context)

{
  if (payload != (void *)0x0) {
    fwrite("Element",7,1,(FILE *)data);
    if ((*(byte *)((long)payload + 0x58) & 2) != 0) {
      fwrite(" (global)",9,1,(FILE *)data);
    }
    fprintf((FILE *)data,": \'%s\' ",*(undefined8 *)((long)payload + 0x10));
    if (namespace != (xmlChar *)0x0) {
      fprintf((FILE *)data,"ns \'%s\'",namespace);
    }
    fputc(10,(FILE *)data);
    if ((*(byte *)((long)payload + 0x58) & 0x1d) != 0) {
      fwrite("  props: ",9,1,(FILE *)data);
      if ((*(byte *)((long)payload + 0x58) & 8) != 0) {
        fwrite("[fixed] ",8,1,(FILE *)data);
      }
      if ((*(byte *)((long)payload + 0x58) & 4) != 0) {
        fwrite("[default] ",10,1,(FILE *)data);
      }
      if ((*(byte *)((long)payload + 0x58) & 0x10) != 0) {
        fwrite("[abstract] ",0xb,1,(FILE *)data);
      }
      if ((*(byte *)((long)payload + 0x58) & 1) != 0) {
        fwrite("[nillable] ",0xb,1,(FILE *)data);
      }
      fputc(10,(FILE *)data);
    }
    if (*(long *)((long)payload + 0x90) != 0) {
      fprintf((FILE *)data,"  value: \'%s\'\n");
    }
    if (*(long *)((long)payload + 0x68) == 0) {
      if (*(xmlSchemaTypePtr *)((long)payload + 0x38) != (xmlSchemaTypePtr)0x0) {
        xmlSchemaTypeDump(*(xmlSchemaTypePtr *)((long)payload + 0x38),(FILE *)data);
      }
    }
    else {
      fprintf((FILE *)data,"  type: \'%s\' ");
      if (*(long *)((long)payload + 0x70) == 0) {
        fputc(10,(FILE *)data);
      }
      else {
        fprintf((FILE *)data,"ns \'%s\'\n");
      }
    }
    if (*(long *)((long)payload + 0x78) != 0) {
      fprintf((FILE *)data,"  substitutionGroup: \'%s\' ");
      if (*(long *)((long)payload + 0x80) != 0) {
        fprintf((FILE *)data,"ns \'%s\'\n");
        return;
      }
      fputc(10,(FILE *)data);
      return;
    }
  }
  return;
}

Assistant:

static void
xmlSchemaElementDump(void *payload, void *data,
                     const xmlChar * name ATTRIBUTE_UNUSED,
		     const xmlChar * namespace ATTRIBUTE_UNUSED,
                     const xmlChar * context ATTRIBUTE_UNUSED)
{
    xmlSchemaElementPtr elem = (xmlSchemaElementPtr) payload;
    FILE *output = (FILE *) data;
    if (elem == NULL)
        return;


    fprintf(output, "Element");
    if (elem->flags & XML_SCHEMAS_ELEM_GLOBAL)
	fprintf(output, " (global)");
    fprintf(output, ": '%s' ", elem->name);
    if (namespace != NULL)
	fprintf(output, "ns '%s'", namespace);
    fprintf(output, "\n");
#if 0
    if ((elem->minOccurs != 1) || (elem->maxOccurs != 1)) {
	fprintf(output, "  min %d ", elem->minOccurs);
        if (elem->maxOccurs >= UNBOUNDED)
            fprintf(output, "max: unbounded\n");
        else if (elem->maxOccurs != 1)
            fprintf(output, "max: %d\n", elem->maxOccurs);
        else
            fprintf(output, "\n");
    }
#endif
    /*
    * Misc other properties.
    */
    if ((elem->flags & XML_SCHEMAS_ELEM_NILLABLE) ||
	(elem->flags & XML_SCHEMAS_ELEM_ABSTRACT) ||
	(elem->flags & XML_SCHEMAS_ELEM_FIXED) ||
	(elem->flags & XML_SCHEMAS_ELEM_DEFAULT)) {
	fprintf(output, "  props: ");
	if (elem->flags & XML_SCHEMAS_ELEM_FIXED)
	    fprintf(output, "[fixed] ");
	if (elem->flags & XML_SCHEMAS_ELEM_DEFAULT)
	    fprintf(output, "[default] ");
	if (elem->flags & XML_SCHEMAS_ELEM_ABSTRACT)
	    fprintf(output, "[abstract] ");
	if (elem->flags & XML_SCHEMAS_ELEM_NILLABLE)
	    fprintf(output, "[nillable] ");
	fprintf(output, "\n");
    }
    /*
    * Default/fixed value.
    */
    if (elem->value != NULL)
	fprintf(output, "  value: '%s'\n", elem->value);
    /*
    * Type.
    */
    if (elem->namedType != NULL) {
	fprintf(output, "  type: '%s' ", elem->namedType);
	if (elem->namedTypeNs != NULL)
	    fprintf(output, "ns '%s'\n", elem->namedTypeNs);
	else
	    fprintf(output, "\n");
    } else if (elem->subtypes != NULL) {
	/*
	* Dump local types.
	*/
	xmlSchemaTypeDump(elem->subtypes, output);
    }
    /*
    * Substitution group.
    */
    if (elem->substGroup != NULL) {
	fprintf(output, "  substitutionGroup: '%s' ", elem->substGroup);
	if (elem->substGroupNs != NULL)
	    fprintf(output, "ns '%s'\n", elem->substGroupNs);
	else
	    fprintf(output, "\n");
    }
}